

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ViewGetColumnNames(Parse *pParse,Table *pTable)

{
  sqlite3 *db_00;
  sqlite3_xauth p_Var1;
  int iVar2;
  Select *pSelect;
  Table *pTable_00;
  sqlite3_xauth xAuth;
  sqlite3 *db;
  int n;
  int nErr;
  Select *pSel;
  Table *pSelTab;
  Table *pTable_local;
  Parse *pParse_local;
  
  db._4_4_ = 0;
  db_00 = pParse->db;
  iVar2 = sqlite3VtabCallConnect(pParse,pTable);
  if (iVar2 == 0) {
    if (pTable->nModuleArg == 0) {
      if (pTable->nCol < 1) {
        if (pTable->nCol < 0) {
          sqlite3ErrorMsg(pParse,"view %s is circularly defined",pTable->zName);
          pParse_local._4_4_ = 1;
        }
        else {
          pSelect = sqlite3SelectDup(db_00,pTable->pSelect,0);
          if (pSelect == (Select *)0x0) {
            db._4_4_ = 1;
          }
          else {
            iVar2 = pParse->nTab;
            sqlite3SrcListAssignCursors(pParse,pSelect->pSrc);
            pTable->nCol = -1;
            (db_00->lookaside).bDisable = (db_00->lookaside).bDisable + 1;
            p_Var1 = db_00->xAuth;
            db_00->xAuth = (sqlite3_xauth)0x0;
            pTable_00 = sqlite3ResultSetOfSelect(pParse,pSelect);
            db_00->xAuth = p_Var1;
            pParse->nTab = iVar2;
            if (pTable->pCheck == (ExprList *)0x0) {
              if (pTable_00 == (Table *)0x0) {
                pTable->nCol = 0;
              }
              else {
                pTable->nCol = pTable_00->nCol;
                pTable->aCol = pTable_00->aCol;
                pTable_00->nCol = 0;
                pTable_00->aCol = (Column *)0x0;
              }
              db._4_4_ = (uint)(pTable_00 == (Table *)0x0);
            }
            else {
              sqlite3ColumnsFromExprList(pParse,pTable->pCheck,&pTable->nCol,&pTable->aCol);
              if (((db_00->mallocFailed == '\0') && (pParse->nErr == 0)) &&
                 ((int)pTable->nCol == pSelect->pEList->nExpr)) {
                sqlite3SelectAddColumnTypeAndCollation(pParse,pTable,pSelect);
              }
            }
            sqlite3DeleteTable(db_00,pTable_00);
            sqlite3SelectDelete(db_00,pSelect);
            (db_00->lookaside).bDisable = (db_00->lookaside).bDisable - 1;
          }
          pTable->pSchema->schemaFlags = pTable->pSchema->schemaFlags | 2;
          pParse_local._4_4_ = db._4_4_;
        }
      }
      else {
        pParse_local._4_4_ = 0;
      }
    }
    else {
      pParse_local._4_4_ = 0;
    }
  }
  else {
    pParse_local._4_4_ = 1;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ViewGetColumnNames(Parse *pParse, Table *pTable){
  Table *pSelTab;   /* A fake table from which we get the result set */
  Select *pSel;     /* Copy of the SELECT that implements the view */
  int nErr = 0;     /* Number of errors encountered */
  int n;            /* Temporarily holds the number of cursors assigned */
  sqlite3 *db = pParse->db;  /* Database connection for malloc errors */
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth;       /* Saved xAuth pointer */
#endif

  assert( pTable );

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( sqlite3VtabCallConnect(pParse, pTable) ){
    return SQLITE_ERROR;
  }
  if( IsVirtual(pTable) ) return 0;
#endif

#ifndef SQLITE_OMIT_VIEW
  /* A positive nCol means the columns names for this view are
  ** already known.
  */
  if( pTable->nCol>0 ) return 0;

  /* A negative nCol is a special marker meaning that we are currently
  ** trying to compute the column names.  If we enter this routine with
  ** a negative nCol, it means two or more views form a loop, like this:
  **
  **     CREATE VIEW one AS SELECT * FROM two;
  **     CREATE VIEW two AS SELECT * FROM one;
  **
  ** Actually, the error above is now caught prior to reaching this point.
  ** But the following test is still important as it does come up
  ** in the following:
  ** 
  **     CREATE TABLE main.ex1(a);
  **     CREATE TEMP VIEW ex1 AS SELECT a FROM ex1;
  **     SELECT * FROM temp.ex1;
  */
  if( pTable->nCol<0 ){
    sqlite3ErrorMsg(pParse, "view %s is circularly defined", pTable->zName);
    return 1;
  }
  assert( pTable->nCol>=0 );

  /* If we get this far, it means we need to compute the table names.
  ** Note that the call to sqlite3ResultSetOfSelect() will expand any
  ** "*" elements in the results set of the view and will assign cursors
  ** to the elements of the FROM clause.  But we do not want these changes
  ** to be permanent.  So the computation is done on a copy of the SELECT
  ** statement that defines the view.
  */
  assert( pTable->pSelect );
  pSel = sqlite3SelectDup(db, pTable->pSelect, 0);
  if( pSel ){
    n = pParse->nTab;
    sqlite3SrcListAssignCursors(pParse, pSel->pSrc);
    pTable->nCol = -1;
    db->lookaside.bDisable++;
#ifndef SQLITE_OMIT_AUTHORIZATION
    xAuth = db->xAuth;
    db->xAuth = 0;
    pSelTab = sqlite3ResultSetOfSelect(pParse, pSel);
    db->xAuth = xAuth;
#else
    pSelTab = sqlite3ResultSetOfSelect(pParse, pSel);
#endif
    pParse->nTab = n;
    if( pTable->pCheck ){
      /* CREATE VIEW name(arglist) AS ...
      ** The names of the columns in the table are taken from
      ** arglist which is stored in pTable->pCheck.  The pCheck field
      ** normally holds CHECK constraints on an ordinary table, but for
      ** a VIEW it holds the list of column names.
      */
      sqlite3ColumnsFromExprList(pParse, pTable->pCheck, 
                                 &pTable->nCol, &pTable->aCol);
      if( db->mallocFailed==0 
       && pParse->nErr==0
       && pTable->nCol==pSel->pEList->nExpr
      ){
        sqlite3SelectAddColumnTypeAndCollation(pParse, pTable, pSel);
      }
    }else if( pSelTab ){
      /* CREATE VIEW name AS...  without an argument list.  Construct
      ** the column names from the SELECT statement that defines the view.
      */
      assert( pTable->aCol==0 );
      pTable->nCol = pSelTab->nCol;
      pTable->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      assert( sqlite3SchemaMutexHeld(db, 0, pTable->pSchema) );
    }else{
      pTable->nCol = 0;
      nErr++;
    }
    sqlite3DeleteTable(db, pSelTab);
    sqlite3SelectDelete(db, pSel);
    db->lookaside.bDisable--;
  } else {
    nErr++;
  }
  pTable->pSchema->schemaFlags |= DB_UnresetViews;
#endif /* SQLITE_OMIT_VIEW */
  return nErr;  
}